

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretWord.cpp
# Opt level: O3

bool userWon(string *verify,char (*guesses) [10])

{
  size_type sVar1;
  int i;
  long lVar2;
  int iVar3;
  size_type sVar4;
  
  sVar1 = verify->_M_string_length;
  lVar2 = 0;
  iVar3 = 0;
  do {
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        iVar3 = iVar3 + (uint)((verify->_M_dataplus)._M_p[sVar4] == (*guesses)[lVar2]);
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  return sVar1 == (long)iVar3;
}

Assistant:

bool userWon(string verify, char (&guesses)[GUESS_NUM])
{
    //function to see if our user has won the game yet
    //returns true or false
    //this checks the number of correct guessed characters verses the number of unique letters

    int correctGuesses = 0;

    for(int i = 0; i < GUESS_NUM; i++)
    {
        for(int j = 0; j < verify.length(); j++)
        {
            if(verify.at(j) == guesses[i])
            {
                correctGuesses++;
            }
        }
    }

    if(correctGuesses == verify.length())
    {
        return true;
    }
    else
    {
        return false;
    }
}